

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O1

VectorXd __thiscall Tools::CalculateRMSE(Tools *this,MeasurementContainer *measurements)

{
  Measurement *pMVar1;
  DenseIndex DVar2;
  double *pdVar3;
  double *pdVar4;
  DenseStorage<double,__1,__1,_1,_0> *this_00;
  Index size;
  Index index;
  ulong uVar5;
  pointer ppMVar6;
  long lVar7;
  ulong uVar8;
  char *__function;
  Index othersize;
  long lVar9;
  DenseIndex extraout_RDX;
  pointer ppMVar10;
  Index size_5;
  Index index_4;
  double dVar11;
  double dVar12;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  VectorXd VVar15;
  VectorXd rmse;
  VectorXd gtc;
  VectorXd eso;
  VectorXd residual;
  VectorXd gto;
  VectorXd esc;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  tmp;
  DenseStorage<double,__1,__1,_1,_0> local_c8;
  scalar_sum_op<double> local_b1;
  DenseStorage<double,__1,__1,_1,_0> local_b0;
  DenseStorage<double,__1,__1,_1,_0> local_a0;
  DenseStorage<double,__1,__1,_1,_0> local_90;
  DenseStorage<double,__1,__1,_1,_0> local_80;
  DenseStorage<double,__1,__1,_1,_0> local_70;
  MeasurementContainer *local_60;
  double local_58;
  undefined8 uStack_50;
  DenseStorage<double,__1,__1,_1,_0> *local_48;
  SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_40;
  
  local_60 = measurements;
  local_48 = (DenseStorage<double,__1,__1,_1,_0> *)this;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_c8,7,7,1);
  if (local_c8.m_rows < 0) {
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (1 < local_c8.m_rows) {
    uVar5 = 0;
    do {
      local_c8.m_data[uVar5] = 0.0;
      (local_c8.m_data + uVar5)[1] = 0.0;
      uVar5 = uVar5 + 2;
    } while (uVar5 < (local_c8.m_rows & 0x7ffffffffffffffeU));
  }
  if ((long)(local_c8.m_rows & 0x7ffffffffffffffeU) < local_c8.m_rows) {
    memset((void *)((local_c8.m_rows << 3 & 0xfffffffffffffff0U) + (long)local_c8.m_data),0,
           (ulong)((uint)(local_c8.m_rows << 3) & 8));
  }
  ppMVar10 = (local_60->super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppMVar6 = (local_60->super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppMVar10 != ppMVar6) {
    do {
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_70,7,7,1);
      pMVar1 = *ppMVar10;
      DVar2 = (pMVar1->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_a0,DVar2,DVar2,1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_a0,
                 (pMVar1->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows,1);
      if (local_a0.m_rows !=
          (pMVar1->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows) {
LAB_0012ff61:
        __function = 
        "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_0012ffac;
      }
      uVar5 = local_a0.m_rows - (local_a0.m_rows >> 0x3f) & 0xfffffffffffffffe;
      if (1 < local_a0.m_rows) {
        lVar9 = 0;
        do {
          pdVar3 = (pMVar1->estimate_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   lVar9;
          dVar11 = pdVar3[1];
          local_a0.m_data[lVar9] = *pdVar3;
          (local_a0.m_data + lVar9)[1] = dVar11;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)uVar5);
      }
      if ((long)uVar5 < local_a0.m_rows) {
        pdVar3 = (pMVar1->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        do {
          local_a0.m_data[uVar5] = pdVar3[uVar5];
          uVar5 = uVar5 + 1;
        } while (local_a0.m_rows != uVar5);
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_b0,7,7,1);
      pMVar1 = *ppMVar10;
      DVar2 = (pMVar1->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              .m_storage.m_rows;
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_80,DVar2,DVar2,1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_80,
                 (pMVar1->ground_truth_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1);
      if (local_80.m_rows !=
          (pMVar1->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows) goto LAB_0012ff61;
      uVar5 = local_80.m_rows - (local_80.m_rows >> 0x3f) & 0xfffffffffffffffe;
      if (1 < local_80.m_rows) {
        lVar9 = 0;
        do {
          pdVar3 = (pMVar1->ground_truth_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                   lVar9;
          dVar11 = pdVar3[1];
          local_80.m_data[lVar9] = *pdVar3;
          (local_80.m_data + lVar9)[1] = dVar11;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)uVar5);
      }
      if ((long)uVar5 < local_80.m_rows) {
        pdVar3 = (pMVar1->ground_truth_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        do {
          local_80.m_data[uVar5] = pdVar3[uVar5];
          uVar5 = uVar5 + 1;
        } while (local_80.m_rows != uVar5);
      }
      if ((((local_80.m_rows < 1) || (local_b0.m_rows < 1)) ||
          (*local_b0.m_data = *local_80.m_data, local_80.m_rows == 1)) ||
         (((local_b0.m_rows == 1 || (local_b0.m_data[1] = local_80.m_data[1], local_80.m_rows < 3))
          || ((local_b0.m_rows < 3 ||
              ((local_b0.m_data[2] = local_80.m_data[2], local_80.m_rows == 3 ||
               (local_b0.m_rows == 3)))))))) {
LAB_0012ff42:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x18a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      local_58 = local_80.m_data[3];
      local_b0.m_data[3] = local_58;
      dVar11 = local_80.m_data[2] * local_80.m_data[2] + local_80.m_data[3] * local_80.m_data[3];
      uStack_50 = 0;
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      if (local_b0.m_rows < 5) goto LAB_0012ff42;
      local_b0.m_data[4] = dVar11;
      dVar12 = 1.5707963267948966;
      if (0.0001 <= ABS(dVar11)) {
        if (local_80.m_rows < 3) goto LAB_0012ff42;
        dVar12 = acos(local_80.m_data[2] / dVar11);
      }
      if (((((local_b0.m_rows < 6) ||
            (local_b0.m_data[5] =
                  (double)(~-(ulong)(local_58 < 0.0) & (ulong)dVar12 |
                          (ulong)-dVar12 & -(ulong)(local_58 < 0.0)), local_b0.m_rows == 6)) ||
           (local_b0.m_data[6] = 0.0, local_a0.m_rows < 1)) ||
          ((local_70.m_rows < 1 || (*local_70.m_data = *local_a0.m_data, local_a0.m_rows == 1)))) ||
         ((local_70.m_rows == 1 ||
          ((local_70.m_data[1] = local_a0.m_data[1], local_a0.m_rows < 3 || (local_a0.m_rows == 3)))
          ))) goto LAB_0012ff42;
      local_58 = local_a0.m_data[2];
      dVar11 = cos(local_a0.m_data[3]);
      if ((local_70.m_rows < 3) ||
         ((local_70.m_data[2] = local_58 * dVar11, local_a0.m_rows < 3 || (local_a0.m_rows == 3))))
      goto LAB_0012ff42;
      local_58 = local_a0.m_data[2];
      dVar11 = sin(local_a0.m_data[3]);
      if (((local_70.m_rows < 4) ||
          (((local_70.m_data[3] = local_58 * dVar11, local_a0.m_rows < 3 || (local_70.m_rows == 4))
           || (local_70.m_data[4] = local_a0.m_data[2], local_a0.m_rows == 3)))) ||
         (((local_70.m_rows < 6 || (local_70.m_data[5] = local_a0.m_data[3], local_a0.m_rows < 5))
          || (local_70.m_rows == 6)))) goto LAB_0012ff42;
      local_70.m_data[6] = local_a0.m_data[4];
      if (local_70.m_rows != local_b0.m_rows) {
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseBinaryOp.h"
                      ,0x84,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                (&local_90,local_b0.m_rows,local_b0.m_rows,1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_90,
                 local_b0.m_rows,1);
      if (local_90.m_rows != local_b0.m_rows) {
        __function = 
        "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_0012ffac;
      }
      uVar5 = local_90.m_rows - (local_90.m_rows >> 0x3f) & 0xfffffffffffffffe;
      if (1 < local_90.m_rows) {
        lVar9 = 0;
        do {
          dVar11 = (local_70.m_data + lVar9)[1];
          dVar12 = (local_b0.m_data + lVar9)[1];
          local_90.m_data[lVar9] = local_70.m_data[lVar9] - local_b0.m_data[lVar9];
          (local_90.m_data + lVar9)[1] = dVar11 - dVar12;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)uVar5);
      }
      if ((long)uVar5 < local_90.m_rows) {
        do {
          local_90.m_data[uVar5] = local_70.m_data[uVar5] - local_b0.m_data[uVar5];
          uVar5 = uVar5 + 1;
        } while (local_90.m_rows != uVar5);
      }
      if (local_90.m_rows < 0) goto LAB_0012ff78;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_90,
                 local_90.m_rows,1);
      uVar5 = local_90.m_rows - (local_90.m_rows >> 0x3f) & 0xfffffffffffffffe;
      if (1 < local_90.m_rows) {
        lVar9 = 0;
        do {
          dVar11 = local_90.m_data[lVar9];
          dVar12 = (local_90.m_data + lVar9)[1];
          local_90.m_data[lVar9] = dVar11 * dVar11;
          (local_90.m_data + lVar9)[1] = dVar12 * dVar12;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)uVar5);
      }
      if ((long)uVar5 < local_90.m_rows) {
        do {
          local_90.m_data[uVar5] = local_90.m_data[uVar5] * local_90.m_data[uVar5];
          uVar5 = uVar5 + 1;
        } while (local_90.m_rows != uVar5);
      }
      local_40.m_functor = &local_b1;
      local_40.m_matrix = (Matrix<double,__1,_1,_0,__1,_1> *)&local_c8;
      Eigen::
      SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::operator=(&local_40,(Matrix<double,__1,_1,_0,__1,_1> *)&local_90);
      free(local_90.m_data);
      free(local_80.m_data);
      free(local_b0.m_data);
      free(local_a0.m_data);
      free(local_70.m_data);
      ppMVar10 = ppMVar10 + 1;
      ppMVar6 = (local_60->super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    } while (ppMVar10 != ppMVar6);
  }
  if (-1 < local_c8.m_rows) {
    lVar9 = (long)ppMVar6 -
            (long)(local_60->super__Vector_base<Measurement_*,_std::allocator<Measurement_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    lVar7 = lVar9 >> 3;
    auVar14._8_4_ = (int)(lVar9 >> 0x23);
    auVar14._0_8_ = lVar7;
    auVar14._12_4_ = 0x45300000;
    dVar11 = (auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
    uVar5 = local_c8.m_rows & 0x7ffffffffffffffe;
    if (1 < local_c8.m_rows) {
      auVar13._8_8_ = dVar11;
      auVar13._0_8_ = dVar11;
      uVar8 = 0;
      do {
        auVar14 = divpd(*(undefined1 (*) [16])(local_c8.m_data + uVar8),auVar13);
        *(undefined1 (*) [16])(local_c8.m_data + uVar8) = auVar14;
        uVar8 = uVar8 + 2;
      } while (uVar8 < uVar5);
    }
    if ((long)uVar5 < local_c8.m_rows) {
      do {
        local_c8.m_data[uVar5] = local_c8.m_data[uVar5] / dVar11;
        uVar5 = uVar5 + 1;
      } while (local_c8.m_rows != uVar5);
    }
    if (-1 < local_c8.m_rows) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_c8,
                 local_c8.m_rows,1);
      DVar2 = local_c8.m_rows;
      uVar5 = local_c8.m_rows - (local_c8.m_rows >> 0x3f) & 0xfffffffffffffffe;
      if (1 < local_c8.m_rows) {
        lVar9 = 0;
        auVar14 = extraout_XMM0;
        do {
          auVar14 = sqrtpd(auVar14,*(undefined1 (*) [16])(local_c8.m_data + lVar9));
          *(undefined1 (*) [16])(local_c8.m_data + lVar9) = auVar14;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)uVar5);
      }
      if ((long)uVar5 < local_c8.m_rows) {
        do {
          dVar11 = local_c8.m_data[uVar5];
          if (dVar11 < 0.0) {
            dVar11 = sqrt(dVar11);
          }
          else {
            dVar11 = SQRT(dVar11);
          }
          local_c8.m_data[uVar5] = dVar11;
          uVar5 = uVar5 + 1;
        } while (DVar2 != uVar5);
      }
      this_00 = local_48;
      pdVar3 = local_c8.m_data;
      if (local_c8.m_rows < 4) {
        __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                      ,0x8d,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(local_48,4,4,1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,4,1);
      if (this_00->m_rows == 4) {
        lVar9 = 0;
        do {
          dVar11 = (pdVar3 + lVar9)[1];
          pdVar4 = this_00->m_data;
          pdVar4[lVar9] = pdVar3[lVar9];
          (pdVar4 + lVar9)[1] = dVar11;
          lVar9 = lVar9 + 2;
        } while (lVar9 == 2);
        free(local_c8.m_data);
        VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             extraout_RDX;
        VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (double *)this_00;
        return (VectorXd)
               VVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
      }
      __function = 
      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
      ;
LAB_0012ffac:
      __assert_fail("rows() == other.rows() && cols() == other.cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                    ,0x1f9,__function);
    }
  }
LAB_0012ff78:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                ,0xf1,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

VectorXd Tools::CalculateRMSE(const MeasurementContainer measurements) {

    VectorXd rmse(7); // [px, py, vx, vy, v, psi, psi dot]T
    rmse.fill(0.0);
    
    //accumulate squared residuals
    for (MeasurementContainer::const_iterator it=measurements.begin(); it!=measurements.end(); ++it) {

        VectorXd esc(7);                      // calculated estimates
        VectorXd eso = (*it)->estimate_;      // original estimate
        VectorXd gtc(7);                      // calculated ground truth
        VectorXd gto = (*it)->ground_truth_;  // original ground truth

        gtc(0) = gto(0); 
	gtc(1) = gto(1);
        gtc(2) = gto(2);
	gtc(3) = gto(3);
	double s = (gtc(3)<0)?-1.0:1.0; // angle sign
        gtc(4) = sqrt(gto(2)*gto(2)+gto(3)*gto(3));
	gtc(5) = (fabs(gtc(4))<0.0001) ? M_PI/2 : acos(gto(2)/gtc(4));
	gtc(5) *= s;
	gtc(6) = 0;

        esc(0) = eso(0);
	esc(1) = eso(1);
	esc(2) = eso(2) * cos(eso(3));
	esc(3) = eso(2) * sin(eso(3));
	esc(4) = eso(2);
	esc(5) = eso(3);
	esc(6) = eso(4);

        VectorXd residual = esc- gtc;
        
        // coefficient-wise multiplication
        residual = residual.array()*residual.array();
        rmse += residual;
    }
    
    // calculate the mean
    rmse = rmse / measurements.size();
    //calculate the squared root
    rmse = rmse.array().sqrt();

    return rmse.head(4);  // for now, return only px, py, vx, vy
}